

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O0

void convert_line(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *local_18;
  char *cc;
  char *c;
  
  local_18 = out_line;
  cc = in_line;
  do {
    if (*cc == '\0') {
      if (local_18 <= out_line + 0x7f) {
        *local_18 = '\0';
        return;
      }
      panic("convert_line: overflow");
    }
    *local_18 = '\0';
    cVar1 = *cc;
    if ((cVar1 == '\n') || (cVar1 == '\r')) {
      local_18[1] = '\0';
      return;
    }
    if ((cVar1 != '%') || (cc[1] == '\0')) {
      *local_18 = *cc;
      local_18 = local_18 + 1;
      goto LAB_002af566;
    }
    convert_arg(cc[1]);
    pcVar5 = cc + 2;
    switch(cc[2]) {
    case 'A':
      pcVar3 = An(cvt_buf);
      strcat(local_18,pcVar3);
      sVar4 = strlen(local_18);
      local_18 = local_18 + sVar4;
      cc = pcVar5;
      goto LAB_002af566;
    default:
      cc = cc + 1;
      break;
    case 'C':
      cvt_buf[0] = highc(cvt_buf[0]);
      cc = pcVar5;
      break;
    case 'P':
      cvt_buf[0] = highc(cvt_buf[0]);
    case 'p':
      pcVar3 = makeplural(cvt_buf);
      strcpy(cvt_buf,pcVar3);
      cc = pcVar5;
      break;
    case 'S':
      cvt_buf[0] = highc(cvt_buf[0]);
    case 's':
      pcVar3 = s_suffix(cvt_buf);
      strcpy(cvt_buf,pcVar3);
      cc = pcVar5;
      break;
    case 'a':
      pcVar3 = an(cvt_buf);
      strcat(local_18,pcVar3);
      sVar4 = strlen(local_18);
      local_18 = local_18 + sVar4;
      cc = pcVar5;
      goto LAB_002af566;
    case 't':
      iVar2 = strncasecmp(cvt_buf,"the ",4);
      cc = pcVar5;
      if (iVar2 != 0) break;
      strcat(local_18,cvt_buf + 4);
      sVar4 = strlen(local_18);
      local_18 = local_18 + sVar4;
      goto LAB_002af566;
    }
    strcat(local_18,cvt_buf);
    sVar4 = strlen(cvt_buf);
    local_18 = local_18 + sVar4;
LAB_002af566:
    cc = cc + 1;
  } while( true );
}

Assistant:

static void convert_line(void)
{
	char *c, *cc;

	cc = out_line;
	for (c = in_line; *c; c++) {

	    *cc = 0;
	    switch(*c) {

		case '\r':
		case '\n':
			*(++cc) = 0;
			return;

		case '%':
			if (*(c+1)) {
			    convert_arg(*(++c));
			    switch (*(++c)) {

					/* insert "a"/"an" prefix */
				case 'A': strcat(cc, An(cvt_buf));
				    cc += strlen(cc);
				    continue; /* for */
				case 'a': strcat(cc, an(cvt_buf));
				    cc += strlen(cc);
				    continue; /* for */

					/* capitalize */
				case 'C': cvt_buf[0] = highc(cvt_buf[0]);
				    break;

					/* pluralize */
				case 'P': cvt_buf[0] = highc(cvt_buf[0]);
				case 'p': strcpy(cvt_buf, makeplural(cvt_buf));
				    break;

					/* append possessive suffix */
				case 'S': cvt_buf[0] = highc(cvt_buf[0]);
				case 's': strcpy(cvt_buf, s_suffix(cvt_buf));
				    break;

					/* strip any "the" prefix */
				case 't': if (!strncmpi(cvt_buf, "the ", 4)) {
					strcat(cc, &cvt_buf[4]);
					cc += strlen(cc);
					continue; /* for */
				    }
				    break;

				default: --c;	/* undo switch increment */
				    break;
			    }
			    strcat(cc, cvt_buf);
			    cc += strlen(cvt_buf);
			    break;
			}	/* else fall through */

		default:
			*cc++ = *c;
			break;
	    }
	}
	if (cc >= out_line + sizeof out_line)
	    panic("convert_line: overflow");
	*cc = 0;
	return;
}